

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOICompactRewardDecPOMDPDiscrete.cpp
# Opt level: O2

bool __thiscall
TOICompactRewardDecPOMDPDiscrete::SetInitialized(TOICompactRewardDecPOMDPDiscrete *this,bool b)

{
  pointer ppRVar1;
  pointer ppRVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  E *this_00;
  ulong uVar7;
  long lVar8;
  undefined8 uVar9;
  unsigned_long uVar10;
  undefined7 in_register_00000031;
  Index i;
  
  if ((int)CONCAT71(in_register_00000031,b) == 0) {
    b = false;
LAB_004b4fed:
    bVar3 = true;
    (this->super_TOIDecPOMDPDiscrete).field_0x2b8 = b;
  }
  else {
    bVar3 = TOIDecPOMDPDiscrete::SetInitialized(&this->super_TOIDecPOMDPDiscrete,true);
    if (bVar3) {
      ppRVar1 = (this->_m_p_rModels).
                super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppRVar2 = (this->_m_p_rModels).
                super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar5 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                     super_TransitionObservationIndependentMADPDiscrete.
                                     super_MultiAgentDecisionProcess + 0x10))(this);
      if ((long)ppRVar1 - (long)ppRVar2 >> 3 == lVar5) {
        uVar4 = 0;
        do {
          uVar7 = (ulong)uVar4;
          uVar6 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                         super_TransitionObservationIndependentMADPDiscrete.
                                         super_MultiAgentDecisionProcess + 0x10))(this);
          if (uVar6 == uVar7) {
            lVar5 = (**(code **)(*(long *)&((*(this->super_TOIDecPOMDPDiscrete).
                                              _m_individualDecPOMDPDs.
                                              super__Vector_base<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                           super_MultiAgentDecisionProcessDiscrete).
                                           super_MultiAgentDecisionProcess + 0x30))();
            uVar6 = 0;
            goto LAB_004b501a;
          }
          uVar4 = uVar4 + 1;
        } while ((this->_m_p_rModels).
                 super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7] != (RewardModel *)0x0);
        this_00 = (E *)__cxa_allocate_exception(0x28);
        E::E(this_00,
             "TOICompactRewardDecPOMDPDiscrete::SetInitialized(true) : no reward model specified yet! ( _m_p_rModels[i] == 0 )"
            );
      }
      else {
        this_00 = (E *)__cxa_allocate_exception(0x28);
        E::E(this_00,
             "TOICompactRewardDecPOMDPDiscrete::SetInitialized(true) : no reward models specified yet!"
            );
      }
      goto LAB_004b505f;
    }
    bVar3 = false;
  }
  return bVar3;
  while( true ) {
    lVar8 = (**(code **)(*(long *)&((this->super_TOIDecPOMDPDiscrete)._m_individualDecPOMDPDs.
                                    super__Vector_base<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar6]->
                                   super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x30))();
    uVar6 = (ulong)((int)uVar6 + 1);
    if (lVar8 != lVar5) break;
LAB_004b501a:
    uVar7 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                   super_TransitionObservationIndependentMADPDiscrete.
                                   super_MultiAgentDecisionProcess + 0x10))(this);
    if (uVar7 == uVar6) {
      for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
        uVar9 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                       super_TransitionObservationIndependentMADPDiscrete.
                                       _m_individualMADPDs.
                                       super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar5]->
                                       super_MultiAgentDecisionProcess + 0x30))();
        *(undefined8 *)(*(long *)&(this->super_TOIDecPOMDPDiscrete).field_0x2c0 + lVar5 * 8) = uVar9
        ;
        uVar10 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                        super_TransitionObservationIndependentMADPDiscrete.
                                        _m_individualMADPDs.
                                        super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar5]->
                                        super_MultiAgentDecisionProcess + 0x70))();
        (this->_m_nrTwoAgentActions).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar5] = uVar10;
      }
      goto LAB_004b4fed;
    }
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,
       "TOICompactRewardDecPOMDPDiscrete::SetInitialized(true) : all agents are required to have the same state space (same number of individual states)"
      );
LAB_004b505f:
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

bool TOICompactRewardDecPOMDPDiscrete::SetInitialized(bool b)
{
    if(b == false)
    {
        _m_initialized = false;
        return(true);
    }

    if( TOIDecPOMDPDiscrete::SetInitialized(true))
    {
        if( b == true )
        {
            if (_m_p_rModels.size()!=GetNrAgents())
                throw E("TOICompactRewardDecPOMDPDiscrete::SetInitialized(true) : no reward models specified yet!");
                
            for(unsigned int i=0;i!=GetNrAgents();++i)
                if (_m_p_rModels[i] == 0)
                    throw E("TOICompactRewardDecPOMDPDiscrete::SetInitialized(true) : no reward model specified yet! ( _m_p_rModels[i] == 0 )");

            size_t nrStates=GetIndividualDecPOMDPD(0)->GetNrStates();
            for(unsigned int i=0;i!=GetNrAgents();++i)
                if(GetIndividualDecPOMDPD(i)->GetNrStates()!=nrStates)
                    throw E("TOICompactRewardDecPOMDPDiscrete::SetInitialized(true) : all agents are required to have the same state space (same number of individual states)");
        }

        for(Index i=0;i!=2;++i)
        {
            _m_nrTwoAgentStates[i]=GetIndividualMADPD(i)->GetNrStates();
            _m_nrTwoAgentActions[i]=GetIndividualMADPD(i)->GetNrJointActions();
        }

        _m_initialized = b;
        return(true);
    }
    else
        return(false);
}